

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

bool google::protobuf::compiler::ruby::GenerateFile
               (FileDescriptor *file,Printer *printer,string *error)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  bool bVar3;
  int index;
  char *__end;
  long lVar4;
  long lVar5;
  string local_78;
  int local_54;
  string local_50;
  
  io::Printer::Print(printer,
                     "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\n"
                     ,"filename",*(string **)file);
  io::Printer::Print(printer,"require \'google/protobuf\'\n\n");
  bVar3 = *(int *)(file + 0x18) < 1;
  if (0 < *(int *)(file + 0x18)) {
    pFVar2 = FileDescriptor::dependency(file,0);
    bVar1 = MaybeEmitDependency(pFVar2,file,printer,error);
    if (bVar1) {
      index = 1;
      do {
        bVar3 = *(int *)(file + 0x18) <= index;
        if (*(int *)(file + 0x18) <= index) goto LAB_0024a879;
        pFVar2 = FileDescriptor::dependency(file,index);
        bVar1 = MaybeEmitDependency(pFVar2,file,printer,error);
        index = index + 1;
      } while (bVar1);
    }
    if (bVar3 == false) {
      return false;
    }
  }
LAB_0024a879:
  io::Printer::Print(printer,"Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  io::Printer::Indent(printer);
  if (0 < *(int *)(file + 0x58)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      GenerateMessage((Descriptor *)(*(long *)(file + 0x60) + lVar5),printer);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xa8;
    } while (lVar4 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      GenerateEnum((EnumDescriptor *)(*(long *)(file + 0x70) + lVar5),printer);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x38;
    } while (lVar4 < *(int *)(file + 0x68));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n\n");
  lVar4 = **(long **)(file + 8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar4,(*(long **)(file + 8))[1] + lVar4);
  local_54 = GeneratePackageModules(&local_50,printer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(file + 0x58)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
      GenerateMessageAssignment(&local_78,(Descriptor *)(*(long *)(file + 0x60) + lVar4),printer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
      GenerateEnumAssignment(&local_78,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar4),printer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < *(int *)(file + 0x68));
  }
  EndPackageModules(local_54,printer);
  return bVar3;
}

Assistant:

bool GenerateFile(const FileDescriptor* file, io::Printer* printer,
                  string* error) {
  printer->Print(
    "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "# source: $filename$\n"
    "\n",
    "filename", file->name());

  printer->Print(
    "require 'google/protobuf'\n\n");

  for (int i = 0; i < file->dependency_count(); i++) {
    if (!MaybeEmitDependency(file->dependency(i), file, printer, error)) {
      return false;
    }
  }

  printer->Print(
    "Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  printer->Indent();
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessage(file->message_type(i), printer);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(file->enum_type(i), printer);
  }
  printer->Outdent();
  printer->Print(
    "end\n\n");

  int levels = GeneratePackageModules(file->package(), printer);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageAssignment("", file->message_type(i), printer);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumAssignment("", file->enum_type(i), printer);
  }
  EndPackageModules(levels, printer);
  return true;
}